

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_function_prototype
          (CompilerHLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  int iVar5;
  SPIRType *pSVar6;
  ulong uVar7;
  SPIRVariable *pSVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  Parameter *arg;
  long lVar11;
  Parameter *pPVar12;
  string decl;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  string out_argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  string local_1298;
  SPIRFunction *local_1278;
  char *local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  undefined1 local_1248 [288];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&(this->super_CompilerGLSL).local_variable_names,
             &(this->super_CompilerGLSL).resource_names._M_h);
  local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
  local_12b8._M_string_length = 0;
  local_12b8.field_2._M_local_buf[0] = '\0';
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(func->super_IVariant).field_0xc);
  if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
              ((string *)local_1128,&this->super_CompilerGLSL,pSVar6,return_flags);
    ::std::__cxx11::string::_M_append((char *)&local_12b8,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1128,this,pSVar6,0);
    ::std::__cxx11::string::_M_append((char *)&local_12b8,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    ::std::__cxx11::string::append((char *)&local_12b8);
  }
  else {
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_12b8,0,(char *)local_12b8._M_string_length,0x2c18ba);
  }
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    get_inner_entry_point_name_abi_cxx11_((string *)local_1128,this);
    ::std::__cxx11::string::_M_append((char *)&local_12b8,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_1128,this,(ulong)uVar1,1);
    ::std::__cxx11::string::_M_append((char *)&local_12b8,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  ::std::__cxx11::string::append((char *)&local_12b8);
  local_1248._0_8_ = local_1248 + 0x18;
  local_1248._8_8_ = 0;
  local_1248._16_8_ = 8;
  if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    local_1128._8_8_ = 0;
    local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
    local_1128._0_8_ = local_1128 + 0x10;
    ::std::__cxx11::string::append(local_1128);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1298,this,pSVar6,0);
    ::std::__cxx11::string::_M_append(local_1128,(ulong)local_1298._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
      operator_delete(local_1298._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append(local_1128);
    ::std::__cxx11::string::append(local_1128);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_1298,this,pSVar6,0);
    ::std::__cxx11::string::_M_append(local_1128,(ulong)local_1298._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
      operator_delete(local_1298._M_dataplus._M_p);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  sVar2 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  local_1278 = func;
  if (sVar2 != 0) {
    pPVar12 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar11 = sVar2 * 0x14;
    do {
      iVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x37])
                        (this,(ulong)(pPVar12->id).id);
      if ((char)iVar5 == '\0') {
        CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar12->id).id);
        CompilerGLSL::argument_decl_abi_cxx11_
                  ((string *)local_1128,&this->super_CompilerGLSL,pPVar12);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1248,(string *)local_1128);
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (pPVar12->type).id);
        if (((0x1e < (this->hlsl_options).shader_model) && (pSVar6->basetype == SampledImage)) &&
           ((pSVar6->image).dim != DimBuffer)) {
          bVar4 = Compiler::is_depth_image((Compiler *)this,pSVar6,(pPVar12->id).id);
          local_1270 = "SamplerState ";
          if (bVar4) {
            local_1270 = "SamplerComparisonState ";
          }
          to_sampler_expression_abi_cxx11_(&local_1298,this,(pPVar12->id).id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                    (&local_1268,this,pSVar6,(ulong)(pPVar12->id).id);
          join<char_const*,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_1128,(spirv_cross *)&local_1270,(char **)&local_1298,
                     &local_1268,in_R8);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1248,(string *)local_1128);
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
            operator_delete((void *)local_1128._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
            operator_delete(local_1268._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
            operator_delete(local_1298._M_dataplus._M_p);
          }
        }
        uVar7 = (ulong)(pPVar12->id).id;
        if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar7].type == TypeVariable)
           ) {
          pSVar8 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
        }
        else {
          pSVar8 = (SPIRVariable *)0x0;
        }
        if (pSVar8 != (SPIRVariable *)0x0) {
          pSVar8->parameter = pPVar12;
        }
      }
      pPVar12 = pPVar12 + 1;
      lVar11 = lVar11 + -0x14;
    } while (lVar11 != 0);
  }
  sVar2 = (local_1278->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  if (sVar2 != 0) {
    pPVar12 = (local_1278->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              ptr;
    lVar11 = sVar2 * 0x14;
    do {
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar12->id).id);
      CompilerGLSL::argument_decl_abi_cxx11_((string *)local_1128,&this->super_CompilerGLSL,pPVar12)
      ;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,(string *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (ulong)(pPVar12->id).id;
      if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar7].type == TypeVariable))
      {
        pSVar8 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
      }
      else {
        pSVar8 = (SPIRVariable *)0x0;
      }
      if (pSVar8 != (SPIRVariable *)0x0) {
        pSVar8->parameter = pPVar12;
      }
      pPVar12 = pPVar12 + 1;
      lVar11 = lVar11 + -0x14;
    } while (lVar11 != 0);
  }
  local_110 = local_f8;
  local_1128._0_8_ = (pointer)0x0;
  local_1128._8_8_ = 0;
  local_1128._16_8_ = 0;
  sStack_108 = 0;
  local_100 = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  if (local_1248._8_8_ != 0) {
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_1248._0_8_ + local_1248._8_8_ * 0x20);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar10->_M_dataplus)._M_p,
                 pbVar10->_M_string_length);
      if (pbVar10 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_1248._0_8_ + (local_1248._8_8_ - 1) * 0x20)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar9);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1298,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  ::std::__cxx11::string::_M_append((char *)&local_12b8,(ulong)local_1298._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
    operator_delete(local_1298._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_12b8);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_12b8);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
    operator_delete(local_12b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	if (type.array.empty())
	{
		decl += flags_to_qualifiers_glsl(type, return_flags);
		decl += type_to_glsl(type);
		decl += " ";
	}
	else
	{
		// We cannot return arrays in HLSL, so "return" through an out variable.
		decl = "void ";
	}

	if (func.self == ir.default_entry_point)
	{
		decl += get_inner_entry_point_name();
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;

	if (!type.array.empty())
	{
		// Fake array returns by writing to an out array instead.
		string out_argument;
		out_argument += "out ";
		out_argument += type_to_glsl(type);
		out_argument += " ";
		out_argument += "spvReturnValue";
		out_argument += type_to_array_glsl(type, 0);
		arglist.push_back(std::move(out_argument));
	}

	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Flatten a combined sampler to two separate arguments in modern HLSL.
		auto &arg_type = get<SPIRType>(arg.type);
		if (hlsl_options.shader_model > 30 && arg_type.basetype == SPIRType::SampledImage &&
		    arg_type.image.dim != DimBuffer)
		{
			// Manufacture automatic sampler arg for SampledImage texture
			arglist.push_back(join(is_depth_image(arg_type, arg.id) ? "SamplerComparisonState " : "SamplerState ",
			                       to_sampler_expression(arg.id), type_to_array_glsl(arg_type, arg.id)));
		}

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}